

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseComment
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int lenght;
  string<char> local_20;
  
  this->CurrentNodeType = EXN_COMMENT;
  pcVar1 = this->P;
  iVar4 = 1;
  lenght = -5;
  pcVar2 = pcVar1;
  while( true ) {
    pcVar3 = pcVar2 + 1;
    this->P = pcVar3;
    if (iVar4 == 0) break;
    if (*pcVar3 == '<') {
      iVar4 = iVar4 + 1;
    }
    else if (*pcVar3 == '>') {
      iVar4 = iVar4 + -1;
    }
    lenght = lenght + 1;
    pcVar2 = pcVar3;
  }
  this->P = pcVar2 + -2;
  core::string<char>::string<char>(&local_20,pcVar1 + 3,lenght);
  core::string<char>::operator=(&this->NodeName,&local_20);
  core::string<char>::~string(&local_20);
  this->P = this->P + 3;
  return;
}

Assistant:

void parseComment()
	{
		CurrentNodeType = EXN_COMMENT;
		P += 1;

		char_type *pCommentBegin = P;

		int count = 1;

		// move until end of comment reached
		while(count)
		{
			if (*P == L'>')
				--count;
			else
			if (*P == L'<')
				++count;

			++P;
		}

		P -= 3;
		NodeName = core::string<char_type>(pCommentBegin+2, (int)(P - pCommentBegin-2));
		P += 3;
	}